

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decrypt.c
# Opt level: O1

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  long lVar1;
  uint16_t uVar2;
  gf gVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  gf g [65];
  gf s_cmp [128];
  gf s [128];
  gf locator [65];
  uchar r [436];
  gf images [3488];
  gf local_2048 [64];
  undefined2 local_1fc8;
  uint local_1fb8 [164];
  uchar local_1d28 [96];
  undefined1 local_1cc8 [352];
  gf local_1b68 [3488];
  
  memcpy(local_1d28,outlen,0x60);
  lVar5 = 0;
  memset(local_1cc8,0,0x154);
  do {
    uVar2 = load2(out + lVar5);
    *(uint16_t *)((long)local_2048 + lVar5) = uVar2 & 0xfff;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0x80);
  local_1fc8 = 1;
  synd((gf *)(local_1fb8 + 0x40),local_2048,(gf *)in,local_1d28);
  bm((gf *)(local_1fb8 + 0x80),(gf *)(local_1fb8 + 0x40));
  root(local_1b68,(gf *)(local_1fb8 + 0x80),(gf *)in);
  uVar6 = 0;
  memset(ctx,0,0x1b4);
  uVar4 = 0;
  do {
    gVar3 = gf_iszero(local_1b68[uVar6]);
    uVar4 = uVar4 + (gVar3 & 1);
    ctx[uVar6 >> 3 & 0x1fffffff] =
         (EVP_PKEY_CTX)
         ((byte)ctx[uVar6 >> 3 & 0x1fffffff] | (byte)((gVar3 & 1) << ((byte)uVar6 & 7)));
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0xda0);
  synd((gf *)local_1fb8,local_2048,(gf *)in,(uchar *)ctx);
  uVar4 = (uVar4 ^ 0x40) & 0xffff;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  lVar5 = 0;
  do {
    lVar1 = lVar5 * 2;
    uVar4 = uVar4 | *(uint *)((long)local_1fb8 + lVar1) ^
                    *(uint *)((long)local_1fb8 + lVar5 * 2 + 0x100);
    uVar7 = uVar7 | *(uint *)((long)local_1fb8 + lVar1 + 4) ^
                    *(uint *)(local_1d28 + (lVar5 + -0x7e) * 2 + -0x90);
    uVar8 = uVar8 | *(uint *)((long)local_1fb8 + lVar1 + 8) ^
                    *(uint *)(local_1d28 + (lVar5 + -0x7c) * 2 + -0x90);
    uVar9 = uVar9 | *(uint *)((long)local_1fb8 + lVar1 + 0xc) ^
                    *(uint *)(local_1d28 + (lVar5 + -0x7a) * 2 + -0x90);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x80);
  uVar4 = uVar9 | uVar7 | uVar8 | uVar4;
  return (-(uVar4 >> 0x10 | uVar4) & 0xffff) >> 0xf;
}

Assistant:

int decrypt(unsigned char *e, const unsigned char *sk, const unsigned char *c, gf *L)
{
  int i, w = 0;
  uint16_t check;

  unsigned char r[ SYS_N/8 ];

  gf g[ SYS_T+1 ];
//  gf L[ SYS_N ];

  gf s[ SYS_T*2 ];
  gf s_cmp[ SYS_T*2 ];
  gf locator[ SYS_T+1 ];
  gf images[ SYS_N ];

  gf t;

  //

  for (i = 0; i < SYND_BYTES; i++)       r[i] = c[i];
  for (i = SYND_BYTES; i < SYS_N/8; i++) r[i] = 0;

  for (i = 0; i < SYS_T; i++) { g[i] = load2(sk); g[i] &= GFMASK; sk += 2; } g[ SYS_T ] = 1;

  //support_gen(L, sk);

  synd(s, g, L, r);

  bm(locator, s);

  root(images, locator, L);

  //

  for (i = 0; i < SYS_N/8; i++)
    e[i] = 0;

  for (i = 0; i < SYS_N; i++)
  {
    t = gf_iszero(images[i]) & 1;

    e[ i/8 ] |= t << (i%8);
    w += t;

  }

#ifdef KAT
  {
    int k;
    printf("decrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

  synd(s_cmp, g, L, e);

  //

  check = w;
  check ^= SYS_T;

  for (i = 0; i < SYS_T*2; i++)
    check |= s[i] ^ s_cmp[i];

  check -= 1;
  check >>= 15;

  return check ^ 1;
}